

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O3

gnode_t * gnode_class_decl_create
                    (gtoken_s token,char *identifier,gtoken_t access_specifier,
                    gtoken_t storage_specifier,gnode_t *superclass,gnode_r *protocols,
                    gnode_r *declarations,_Bool is_struct,gnode_t *decl)

{
  gnode_t *pgVar1;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0xa0);
  *(_Bool *)((long)&pgVar1[1].tag + 1) = is_struct;
  pgVar1->tag = NODE_CLASS_DECL;
  (pgVar1->token).type = token.type;
  (pgVar1->token).lineno = token.lineno;
  (pgVar1->token).colno = token.colno;
  (pgVar1->token).position = token.position;
  (pgVar1->token).bytes = token.bytes;
  (pgVar1->token).length = token.length;
  (pgVar1->token).fileid = token.fileid;
  (pgVar1->token).builtin = token.builtin;
  (pgVar1->token).value = token.value;
  pgVar1->decl = decl;
  *(undefined1 *)&pgVar1[1].tag = NODE_LIST_STAT;
  *(char **)&pgVar1[1].token.colno = identifier;
  pgVar1[1].token.type = access_specifier;
  pgVar1[1].token.lineno = storage_specifier;
  *(gnode_t **)&pgVar1[1].token.bytes = superclass;
  pgVar1[1].token.value = (char *)protocols;
  *(gnode_r **)&pgVar1[1].is_assignment = declarations;
  *(undefined8 *)&pgVar1[2].block_length = 0;
  return pgVar1;
}

Assistant:

gnode_t *gnode_class_decl_create (gtoken_s token, const char *identifier, gtoken_t access_specifier, gtoken_t storage_specifier, gnode_t *superclass,
                                  gnode_r *protocols, gnode_r *declarations, bool is_struct, gnode_t *decl) {
    gnode_class_decl_t *node = (gnode_class_decl_t *)mem_alloc(NULL, sizeof(gnode_class_decl_t));
    node->is_struct = is_struct;

    SETBASE(node, NODE_CLASS_DECL, token);
    SETDECL(node, decl);
    node->bridge = false;
    node->identifier = identifier;
    node->access = access_specifier;
    node->storage = storage_specifier;
    node->superclass = superclass;
    node->protocols = protocols;
    node->decls = declarations;
    node->nivar = 0;
    node->nsvar = 0;

    return (gnode_t *)node;
}